

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

Nonnull<const_char_*> __thiscall
absl::lts_20250127::BadStatusOrAccess::what(BadStatusOrAccess *this)

{
  Nonnull<const_char_*> pcVar1;
  BadStatusOrAccess *this_local;
  
  InitWhat(this);
  pcVar1 = (Nonnull<const_char_*>)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> BadStatusOrAccess::what() const noexcept {
  InitWhat();
  return what_.c_str();
}